

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O3

uint8 * google::protobuf::internal::WireFormatLite::WriteStringToArray
                  (int field_number,string *value,uint8 *target)

{
  bool bVar1;
  uint uVar2;
  uint8 *puVar3;
  uint uVar4;
  
  uVar2 = field_number * 8 + 2;
  uVar4 = uVar2;
  if (0x7f < (uint)(field_number << 3)) {
    do {
      *target = (byte)uVar2 | 0x80;
      uVar4 = uVar2 >> 7;
      target = target + 1;
      bVar1 = 0x3fff < uVar2;
      uVar2 = uVar4;
    } while (bVar1);
  }
  *target = (byte)uVar4;
  puVar3 = io::CodedOutputStream::WriteStringWithSizeToArray(value,target + 1);
  return puVar3;
}

Assistant:

inline uint32 WireFormatLite::MakeTag(int field_number, WireType type) {
  return GOOGLE_PROTOBUF_WIRE_FORMAT_MAKE_TAG(field_number, type);
}